

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O0

void __thiscall UInt128_ExplicitCtor_Test::TestBody(UInt128_ExplicitCtor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_100;
  Message local_f8;
  uint64_t local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  uint local_c4;
  uint64_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  uint128 v2;
  Message local_90;
  uint64_t local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  uint64_t local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  uint128 v1;
  unsigned_long local_20;
  uint64_t low;
  uint64_t high;
  UInt128_ExplicitCtor_Test *this_local;
  
  low = 7;
  local_20 = 5;
  high = (uint64_t)this;
  pstore::uint128::uint128((uint128 *)&gtest_ar.message_,7,5);
  local_50 = pstore::uint128::high((uint128 *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_48,"v1.high ()","high",&local_50,&low);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_uint128.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  local_88 = pstore::uint128::low((uint128 *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_80,"v1.low ()","low",&local_88,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&v2.v_ + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_uint128.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&v2.v_ + 8),&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&v2.v_ + 8));
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pstore::uint128::uint128<unsigned_long,void>((uint128 *)&gtest_ar_2.message_,5);
  local_c0 = pstore::uint128::high((uint128 *)&gtest_ar_2.message_);
  local_c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_b8,"v2.high ()","0U",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_uint128.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_f0 = pstore::uint128::low((uint128 *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_e8,"v2.low ()","low",&local_f0,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_uint128.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  return;
}

Assistant:

TEST_F (UInt128, ExplicitCtor) {
    constexpr auto high = std::uint64_t{7};
    constexpr auto low = std::uint64_t{5};
    {
        pstore::uint128 v1{high, low};
        EXPECT_EQ (v1.high (), high);
        EXPECT_EQ (v1.low (), low);
    }
    {
        pstore::uint128 v2{low};
        EXPECT_EQ (v2.high (), 0U);
        EXPECT_EQ (v2.low (), low);
    }
}